

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectGlow.cpp
# Opt level: O0

SharedPtr<FontEffect> __thiscall
Rml::FontEffectGlowInstancer::InstanceFontEffect
          (FontEffectGlowInstancer *this,String *param_1,PropertyDictionary *properties)

{
  Vector2i _offset;
  bool bVar1;
  int _width_outline;
  Property *pPVar2;
  element_type *peVar3;
  Vector2i in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SharedPtr<FontEffect> SVar4;
  undefined1 local_50 [8];
  SharedPtr<Rml::FontEffectGlow> font_effect;
  int local_38;
  Colourb color;
  int width_blur;
  int width_outline;
  Vector2i offset;
  PropertyDictionary *properties_local;
  String *param_1_local;
  FontEffectGlowInstancer *this_local;
  
  offset = in_RCX;
  Vector2<int>::Vector2((Vector2<int> *)&width_blur);
  pPVar2 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)offset,param_1[4].field_2._M_local_buf[0]);
  _width_outline = Property::Get<int>(pPVar2);
  pPVar2 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)offset,param_1[4].field_2._M_local_buf[1]);
  local_38 = Property::Get<int>(pPVar2);
  pPVar2 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)offset,param_1[4].field_2._M_local_buf[2]);
  width_blur = Property::Get<int>(pPVar2);
  pPVar2 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)offset,param_1[4].field_2._M_local_buf[3]);
  width_outline = Property::Get<int>(pPVar2);
  pPVar2 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)offset,param_1[4].field_2._M_local_buf[4]);
  font_effect.super___shared_ptr<Rml::FontEffectGlow,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = Property::Get<Rml::Colour<unsigned_char,255,false>>(pPVar2);
  if (local_38 < 0) {
    local_38 = _width_outline;
  }
  MakeShared<Rml::FontEffectGlow>();
  peVar3 = ::std::__shared_ptr_access<Rml::FontEffectGlow,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Rml::FontEffectGlow,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
  _offset.y = width_outline;
  _offset.x = width_blur;
  bVar1 = FontEffectGlow::Initialise(peVar3,_width_outline,local_38,_offset);
  if (bVar1) {
    peVar3 = ::std::
             __shared_ptr_access<Rml::FontEffectGlow,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Rml::FontEffectGlow,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
    FontEffect::SetColour
              (&peVar3->super_FontEffect,
               font_effect.super___shared_ptr<Rml::FontEffectGlow,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_);
    ::std::shared_ptr<Rml::FontEffect>::shared_ptr<Rml::FontEffectGlow,void>
              ((shared_ptr<Rml::FontEffect> *)this,(shared_ptr<Rml::FontEffectGlow> *)local_50);
  }
  else {
    ::std::shared_ptr<Rml::FontEffect>::shared_ptr
              ((shared_ptr<Rml::FontEffect> *)this,(nullptr_t)0x0);
  }
  ::std::shared_ptr<Rml::FontEffectGlow>::~shared_ptr((shared_ptr<Rml::FontEffectGlow> *)local_50);
  SVar4.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar4.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SharedPtr<FontEffect>)
         SVar4.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<FontEffect> FontEffectGlowInstancer::InstanceFontEffect(const String& /*name*/, const PropertyDictionary& properties)
{
	Vector2i offset;
	int width_outline = properties.GetProperty(id_width_outline)->Get<int>();
	int width_blur = properties.GetProperty(id_width_blur)->Get<int>();
	offset.x = properties.GetProperty(id_offset_x)->Get<int>();
	offset.y = properties.GetProperty(id_offset_y)->Get<int>();
	Colourb color = properties.GetProperty(id_color)->Get<Colourb>();

	if (width_blur < 0)
		width_blur = width_outline;

	auto font_effect = MakeShared<FontEffectGlow>();
	if (font_effect->Initialise(width_outline, width_blur, offset))
	{
		font_effect->SetColour(color);
		return font_effect;
	}

	return nullptr;
}